

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * __thiscall
duckdb::Value::Numeric(Value *__return_storage_ptr__,Value *this,LogicalType *type,uhugeint_t value)

{
  LogicalTypeId LVar1;
  LogicalType *value_00;
  uhugeint_t value_01;
  
  value_01.upper = value.lower;
  LVar1 = (this->type_).id_;
  if (LVar1 == UBIGINT) {
    value_00 = (LogicalType *)0x0;
    if (value_01.upper == 0) {
      value_00 = type;
    }
    UBIGINT(__return_storage_ptr__,(uint64_t)value_00);
  }
  else if (LVar1 == UHUGEINT) {
    value_01.lower = value_01.upper;
    UHUGEINT(__return_storage_ptr__,(Value *)type,value_01);
  }
  else {
    if ((long)type < 0) {
      type = (LogicalType *)0x0;
    }
    if (value_01.upper != 0) {
      type = (LogicalType *)0x0;
    }
    Numeric(__return_storage_ptr__,&this->type_,(int64_t)type);
  }
  return __return_storage_ptr__;
}

Assistant:

Value Value::Numeric(const LogicalType &type, uhugeint_t value) {
#ifdef DEBUG
	// perform a throwing cast to verify that the type fits
	Value::UHUGEINT(value).DefaultCastAs(type);
#endif
	switch (type.id()) {
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(value);
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(Uhugeint::Cast<uint64_t>(value));
	default:
		return Value::Numeric(type, Uhugeint::Cast<int64_t>(value));
	}
}